

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O1

void mxx::gather<unsigned_int>(uint *data,size_t size,uint *out,int root,comm *comm)

{
  datatype dt;
  
  if (0x7ffffffe < (long)comm->m_size * size) {
    impl::gather_big<unsigned_int>(data,size,out,root,comm);
    return;
  }
  dt._vptr_datatype = (_func_int **)&PTR__datatype_00169300;
  dt.mpitype = (MPI_Datatype)&ompi_mpi_unsigned;
  dt.builtin = true;
  MPI_Gather();
  datatype::~datatype(&dt);
  return;
}

Assistant:

void gather(const T* data, size_t size, T* out, int root, const mxx::comm& comm = mxx::comm()) {
    if (size*comm.size() >= mxx::max_int) {
        // use custom implementation for big data
        impl::gather_big(data, size, out, root, comm);
    } else {
        mxx::datatype dt = mxx::get_datatype<T>();
        MPI_Gather(const_cast<T*>(data), size, dt.type(), out, size, dt.type(), root, comm);
    }
}